

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::Softmax::forward_impl
          (Softmax *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  Tensor *this_00;
  undefined1 auVar1 [16];
  undefined8 uVar2;
  runtime_error *this_01;
  char *__function;
  long lVar3;
  float fVar4;
  undefined1 auVar5 [64];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  scalar_sum_op<float,_float> local_bd;
  float local_bc;
  undefined1 local_b8 [16];
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_a8;
  MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
  local_88;
  redux_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
  local_50;
  undefined1 extraout_var [60];
  
  this_00 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  if ((1 < (this_00->d).nd) && ((this_00->d).d[1] != 1)) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Softmax not yet implemented for multiple columns");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Tensor::operator*(&local_a8,this_00);
  if ((0 < local_a8.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value) &&
     (0 < local_a8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value)) {
    local_88.m_expression._0_8_ =
         local_a8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_data;
    local_88.m_expression.m_xpr.m_expression.m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value =
         local_a8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    auVar5._0_4_ = Eigen::internal::
                   redux_impl<Eigen::internal::scalar_max_op<float,float,0>,Eigen::internal::redux_evaluator<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>,3,0>
                   ::run<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                             ((redux_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                               *)&local_88,(scalar_max_op<float,_float,_0> *)&local_50,&local_a8);
    auVar5._4_60_ = extraout_var;
    auVar1._8_4_ = 0x80000000;
    auVar1._0_8_ = 0x8000000080000000;
    auVar1._12_4_ = 0x80000000;
    local_b8 = vxorps_avx512vl(auVar5._0_16_,auVar1);
    local_88.m_expression.m_xpr.m_expression.m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_cols.m_value =
         local_a8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_cols.m_value;
    local_88.m_expression.m_xpr.m_expression.m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data = local_a8.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data;
    local_88.m_expression.m_xpr.m_expression.m_xpr.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_rows.m_value =
         local_a8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value;
    local_88.m_expression.m_xpr.m_expression.m_functor.c = local_b8._0_4_;
    if ((PointerType)
        local_a8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value == (PointerType)0x0 ||
        (PointerType)
        local_a8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value == (PointerType)0x0) {
      fVar4 = 0.0;
    }
    else {
      if ((local_a8.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value < 1) ||
         (local_a8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value < 1)) {
        __function = 
        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::MatrixWrapper<const Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>, const Eigen::ArrayWrapper<const Eigen::CwiseUnaryOp<cnn::const_add_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>>>>::redux(const Func &) const [Derived = Eigen::MatrixWrapper<const Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>, const Eigen::ArrayWrapper<const Eigen::CwiseUnaryOp<cnn::const_add_op<float>, const Eigen::Map<Eigen::Matrix<float, -1, -1>>>>>>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
        ;
        goto LAB_0019c41c;
      }
      local_50.
      super_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
      .
      super_unary_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>,_Eigen::internal::IndexBased,_float>
      .
      super_evaluator_wrapper_base<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
      .m_argImpl.
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::internal::IndexBased,_float>
      .m_d.argImpl.
      super_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
      .
      super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_float>
      .
      super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
      .m_argImpl.
      super_unary_evaluator<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
      .m_d.argImpl.
      super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
      .
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_data = local_a8.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_50.
      super_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
      .
      super_unary_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>,_Eigen::internal::IndexBased,_float>
      .
      super_evaluator_wrapper_base<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
      .m_argImpl.
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::internal::IndexBased,_float>
      .m_d.argImpl.
      super_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
      .
      super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_float>
      .
      super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
      .m_argImpl.
      super_unary_evaluator<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
      .m_d.argImpl.
      super_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
      .
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_outerStride.m_value =
           local_a8.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_50.
      super_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
      .
      super_unary_evaluator<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>,_Eigen::internal::IndexBased,_float>
      .
      super_evaluator_wrapper_base<Eigen::MatrixWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>_>
      .m_argImpl.
      super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::internal::IndexBased,_float>
      .m_d.argImpl.
      super_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
      .
      super_unary_evaluator<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>,_Eigen::internal::IndexBased,_float>
      .
      super_evaluator_wrapper_base<Eigen::ArrayWrapper<const_Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>
      .m_argImpl.
      super_unary_evaluator<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::IndexBased,_float>
      .m_d.op.c = local_88.m_expression.m_xpr.m_expression.m_functor.c;
      fVar4 = Eigen::internal::
              redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,Eigen::ArrayWrapper<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>const>const>const>const>>,3,0>
              ::
              run<Eigen::MatrixWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,Eigen::ArrayWrapper<Eigen::CwiseUnaryOp<cnn::const_add_op<float>,Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>const>const>const>const>>
                        (&local_50,&local_bd,&local_88);
    }
    local_bc = logf(fVar4);
    Tensor::operator*((Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> *)
                      &local_88,fx);
    uVar2 = local_88.m_expression._0_8_;
    if ((local_88.m_expression.m_xpr.m_expression.m_xpr.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_data ==
         (PointerType)
         local_a8.
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value) &&
       (local_88.m_expression.m_xpr.m_expression.m_xpr.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value ==
        local_a8.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value)) {
      if (0 < local_a8.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value *
              local_a8.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value) {
        lVar3 = 0;
        local_b8._0_4_ = (float)local_b8._0_4_ - local_bc;
        do {
          fVar4 = expf((float)local_b8._0_4_ +
                       local_a8.
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_data[lVar3]);
          *(float *)(uVar2 + lVar3 * 4) = fVar4;
          lVar3 = lVar3 + 1;
        } while (local_a8.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_cols.m_value *
                 local_a8.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value - lVar3 != 0);
      }
      return;
    }
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                  "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>]"
                 );
  }
  __function = 
  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::redux(const Func &) const [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, BinaryOp = Eigen::internal::scalar_max_op<float>]"
  ;
LAB_0019c41c:
  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                "/usr/include/eigen3/Eigen/src/Core/Redux.h",0x19b,__function);
}

Assistant:

void Softmax::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  if (xs[0]->d.cols() == 1) {
#if HAVE_CUDA
    gpu::softmax(xs[0]->d.size(), xs[0]->v, fx.v);
#else
    auto x = **xs[0];
    *fx = x.unaryExpr(FSoftmaxNormalize(logsumexp(x)));
#endif
  } else {
    throw std::runtime_error("Softmax not yet implemented for multiple columns");
  }
}